

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::Next
          (CopyingInputStreamAdaptor *this,void **data,int *size)

{
  int iVar1;
  uint uVar2;
  pointer __old_p;
  uchar *puVar3;
  
  if (this->failed_ != false) {
    return false;
  }
  puVar3 = (this->buffer_)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar3 == (uchar *)0x0) {
    puVar3 = (uchar *)operator_new__((long)this->buffer_size_);
    (this->buffer_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
    ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar3;
  }
  iVar1 = this->backup_bytes_;
  if ((long)iVar1 < 1) {
    uVar2 = (*this->copying_stream_->_vptr_CopyingInputStream[2])
                      (this->copying_stream_,puVar3,(ulong)(uint)this->buffer_size_);
    this->buffer_used_ = uVar2;
    if ((int)uVar2 < 1) {
      if ((int)uVar2 < 0) {
        this->failed_ = true;
      }
      FreeBuffer(this);
      return false;
    }
    this->position_ = this->position_ + (ulong)uVar2;
    *size = uVar2;
    *data = (this->buffer_)._M_t.
            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  }
  else {
    *data = puVar3 + ((long)this->buffer_used_ - (long)iVar1);
    *size = iVar1;
    this->backup_bytes_ = 0;
  }
  return true;
}

Assistant:

bool CopyingInputStreamAdaptor::Next(const void** data, int* size) {
  if (failed_) {
    // Already failed on a previous read.
    return false;
  }

  AllocateBufferIfNeeded();

  if (backup_bytes_ > 0) {
    // We have data left over from a previous BackUp(), so just return that.
    *data = buffer_.get() + buffer_used_ - backup_bytes_;
    *size = backup_bytes_;
    backup_bytes_ = 0;
    return true;
  }

  // Read new data into the buffer.
  buffer_used_ = copying_stream_->Read(buffer_.get(), buffer_size_);
  if (buffer_used_ <= 0) {
    // EOF or read error.  We don't need the buffer anymore.
    if (buffer_used_ < 0) {
      // Read error (not EOF).
      failed_ = true;
    }
    FreeBuffer();
    return false;
  }
  position_ += buffer_used_;

  *size = buffer_used_;
  *data = buffer_.get();
  return true;
}